

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtarjan.c
# Opt level: O0

void RDL_deleteBCCGraph(RDL_BCCGraph *graph)

{
  uint local_14;
  uint i;
  RDL_BCCGraph *graph_local;
  
  for (local_14 = 0; local_14 < graph->nof_bcc; local_14 = local_14 + 1) {
    RDL_deleteGraph(graph->bcc_graphs[local_14]);
    free(graph->edge_from_bcc_mapping[local_14]);
    free(graph->node_from_bcc_mapping[local_14]);
  }
  free(graph->bcc_graphs);
  free(graph->edge_from_bcc_mapping);
  free(graph->node_from_bcc_mapping);
  free(graph->nof_edges_per_bcc);
  free(graph->nof_nodes_per_bcc);
  for (local_14 = 0; local_14 < graph->complete_graph->V; local_14 = local_14 + 1) {
    free(graph->node_to_bcc_mapping[local_14]);
  }
  free(graph->node_to_bcc_mapping);
  for (local_14 = 0; local_14 < graph->complete_graph->E; local_14 = local_14 + 1) {
    free(graph->edge_to_bcc_mapping[local_14]);
  }
  free(graph->edge_to_bcc_mapping);
  free(graph->nof_bcc_per_node);
  free(graph);
  return;
}

Assistant:

void RDL_deleteBCCGraph(RDL_BCCGraph* graph)
{
  unsigned i;

  for (i = 0; i < graph->nof_bcc; ++i) {
    RDL_deleteGraph(graph->bcc_graphs[i]);
    free(graph->edge_from_bcc_mapping[i]);
    free(graph->node_from_bcc_mapping[i]);
  }
  free(graph->bcc_graphs);
  free(graph->edge_from_bcc_mapping);
  free(graph->node_from_bcc_mapping);
  free(graph->nof_edges_per_bcc);
  free(graph->nof_nodes_per_bcc);

  for (i = 0; i < graph->complete_graph->V; ++i) {
    free(graph->node_to_bcc_mapping[i]);
  }
  free(graph->node_to_bcc_mapping);

  for (i = 0; i < graph->complete_graph->E; ++i) {
    free(graph->edge_to_bcc_mapping[i]);
  }
  free(graph->edge_to_bcc_mapping);
  free(graph->nof_bcc_per_node);
  free(graph);
}